

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CECorrections.cpp
# Opt level: O3

void __thiscall CECorrections::init_members(CECorrections *this)

{
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  this->interp_ = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Jvinniec[P]CppEphem/build_O3/build/share/cppephem/"
             ,&local_51);
  std::operator+(&local_30,&local_50,"/nutation.txt");
  std::__cxx11::string::operator=((string *)&this->nutation_file_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_51);
  std::allocator<int>::allocator((allocator<int> *)&local_50);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_30,0,(allocator_type *)&local_50);
  std::vector<int,_std::allocator<int>_>::operator=
            (&this->nutation_mjd_,(vector<int,_std::allocator<int>_> *)&local_30);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&local_30);
  __gnu_cxx::new_allocator<int>::~new_allocator((new_allocator<int> *)&local_50);
  std::allocator<double>::allocator((allocator<double> *)&local_50);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,0,(allocator_type *)&local_50);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->nutation_dut1_,(vector<double,_std::allocator<double>_> *)&local_30);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_50);
  std::allocator<double>::allocator((allocator<double> *)&local_50);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,0,(allocator_type *)&local_50);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->nutation_xp_,(vector<double,_std::allocator<double>_> *)&local_30);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_50);
  std::allocator<double>::allocator((allocator<double> *)&local_50);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,0,(allocator_type *)&local_50);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->nutation_yp_,(vector<double,_std::allocator<double>_> *)&local_30);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_50);
  std::allocator<double>::allocator((allocator<double> *)&local_50);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,0,(allocator_type *)&local_50);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->nutation_deps_,(vector<double,_std::allocator<double>_> *)&local_30);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_50);
  std::allocator<double>::allocator((allocator<double> *)&local_50);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,0,(allocator_type *)&local_50);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->nutation_dpsi_,(vector<double,_std::allocator<double>_> *)&local_30);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Jvinniec[P]CppEphem/build_O3/build/share/cppephem/"
             ,&local_51);
  std::operator+(&local_30,&local_50,"/ttut1_historic.txt");
  std::__cxx11::string::operator=((string *)&this->ttut1_file_hist_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/Jvinniec[P]CppEphem/build_O3/build/share/cppephem/"
             ,&local_51);
  std::operator+(&local_30,&local_50,"/ttut1_predicted.txt");
  std::__cxx11::string::operator=((string *)&this->ttut1_file_pred_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  __gnu_cxx::new_allocator<char>::~new_allocator((new_allocator<char> *)&local_51);
  std::allocator<double>::allocator((allocator<double> *)&local_50);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,0,(allocator_type *)&local_50);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->ttut1_mjd_,(vector<double,_std::allocator<double>_> *)&local_30);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_50);
  std::allocator<double>::allocator((allocator<double> *)&local_50);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,0,(allocator_type *)&local_50);
  std::vector<double,_std::allocator<double>_>::operator=
            (&this->ttut1_delt_,(vector<double,_std::allocator<double>_> *)&local_30);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&local_30);
  __gnu_cxx::new_allocator<double>::~new_allocator((new_allocator<double> *)&local_50);
  this->cache_nut_mjd_ = -1e+30;
  this->cache_nut_dut1_ = 0.0;
  this->cache_nut_xp_ = 0.0;
  this->cache_nut_yp_ = 0.0;
  this->cache_nut_deps_ = 0.0;
  this->cache_nut_dpsi_ = 0.0;
  this->cache_ttut1_mjd_ = -1e+30;
  this->cache_ttut1_delt_ = 63.8285;
  return;
}

Assistant:

void CECorrections::init_members(void)
{
    // Note that CECORRFILEPATH is defined at compile time
    interp_ = false;

    nutation_file_ = std::string(CECORRFILEPATH) + "/nutation.txt";
    nutation_mjd_  = std::vector<int>(0);
    nutation_dut1_ = std::vector<double>(0);
    nutation_xp_   = std::vector<double>(0);
    nutation_yp_   = std::vector<double>(0);
    nutation_deps_ = std::vector<double>(0);
    nutation_dpsi_ = std::vector<double>(0);

    ttut1_file_hist_ = std::string(CECORRFILEPATH) + "/ttut1_historic.txt";
    ttut1_file_pred_ = std::string(CECORRFILEPATH) + "/ttut1_predicted.txt";
    ttut1_mjd_       = std::vector<double>(0);
    ttut1_delt_      = std::vector<double>(0); 

    // Nutation cached values
    cache_nut_mjd_  = -1e30;
    cache_nut_dut1_ = 0.0;
    cache_nut_xp_   = 0.0;
    cache_nut_yp_   = 0.0;
    cache_nut_deps_ = 0.0;
    cache_nut_dpsi_ = 0.0;

    // TT-UT1 cached values
    cache_ttut1_mjd_  = -1e30;
    cache_ttut1_delt_ = 63.8285; // Default to J2000 reference date value
}